

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringStream.c
# Opt level: O1

void sysbvm_stringStream_nextPut
               (sysbvm_context_t *context,sysbvm_tuple_t stringStream,uint8_t character)

{
  ulong requiredCapacity;
  ulong uVar1;
  long lVar2;
  sysbvm_tuple_t sVar3;
  
  if ((stringStream & 0xf) == 0 && stringStream != 0) {
    uVar1 = *(ulong *)(stringStream + 0x10);
    if (uVar1 == 0 || (uVar1 & 0xf) != 0) {
      lVar2 = (long)uVar1 >> 4;
    }
    else {
      lVar2 = *(long *)(uVar1 + 0x10);
    }
    uVar1 = *(ulong *)(stringStream + 0x18);
    if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
      uVar1 = (ulong)*(uint *)(uVar1 + 0xc);
    }
    else {
      uVar1 = 0;
    }
    requiredCapacity = lVar2 + 1;
    if (uVar1 < requiredCapacity) {
      sysbvm_stringStream_increaseCapacityToAtLeast(context,stringStream,requiredCapacity);
    }
    *(uint8_t *)(*(long *)(stringStream + 0x18) + 0x10 + lVar2) = character;
    if (lVar2 + 0x800000000000001U >> 0x3c == 0) {
      sVar3 = requiredCapacity * 0x10 | 0xb;
    }
    else {
      sVar3 = sysbvm_tuple_uint64_encodeBig(context,requiredCapacity);
    }
    *(sysbvm_tuple_t *)(stringStream + 0x10) = sVar3;
  }
  return;
}

Assistant:

SYSBVM_API void sysbvm_stringStream_nextPut(sysbvm_context_t *context, sysbvm_tuple_t stringStream, uint8_t character)
{
    if(!sysbvm_tuple_isNonNullPointer(stringStream))
        return;

    sysbvm_stringStream_t *stringStreamObject = (sysbvm_stringStream_t*)stringStream;
    size_t size = sysbvm_tuple_size_decode(stringStreamObject->size);
    size_t capacity = sysbvm_tuple_getSizeInBytes(stringStreamObject->storage);
    size_t requiredCapacity = size + 1;
    if(requiredCapacity > capacity)
        sysbvm_stringStream_increaseCapacityToAtLeast(context, stringStream, requiredCapacity);

    sysbvm_object_tuple_t *storage = (sysbvm_object_tuple_t*)stringStreamObject->storage;
    storage->bytes[size] = character;
    stringStreamObject->size = sysbvm_tuple_size_encode(context, size + 1);

}